

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  cpp_dec_float<200u,int,void> *this_00;
  fpclass_type fVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  pointer pnVar6;
  int32_t iVar9;
  SPxId *pSVar7;
  undefined8 uVar8;
  int32_t iVar10;
  int iVar11;
  int iVar12;
  undefined8 *puVar13;
  long lVar14;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar15;
  int32_t *piVar16;
  fpclass_type fVar17;
  int *piVar18;
  long lVar19;
  int *piVar20;
  pointer pnVar21;
  cpp_dec_float<200u,int,void> *pcVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  undefined4 *puVar24;
  undefined8 *puVar25;
  uint *puVar26;
  undefined4 *puVar27;
  uint *puVar28;
  cpp_dec_float<200U,_int,_void> *pcVar29;
  cpp_dec_float<200U,_int,_void> *pcVar30;
  uint *puVar31;
  undefined4 *puVar32;
  cpp_dec_float<200U,_int,_void> *pcVar33;
  byte bVar34;
  int32_t iVar35;
  fpclass_type fVar36;
  long lVar37;
  long lVar38;
  long in_FS_OFFSET;
  byte bVar39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [13];
  undefined3 uStack_46b;
  int iStack_468;
  bool bStack_464;
  undefined8 local_460;
  int local_454;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  undefined1 local_448 [32];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [13];
  undefined3 uStack_3db;
  int iStack_3d8;
  bool bStack_3d4;
  undefined8 local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  pointer local_3b8;
  Type local_3ac;
  cpp_dec_float<200U,_int,_void> *local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [32];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [13];
  undefined3 uStack_32b;
  int iStack_328;
  bool bStack_324;
  undefined8 local_320;
  fpclass_type *local_318;
  fpclass_type *local_310;
  pointer local_308;
  undefined8 local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [13];
  undefined3 uStack_28b;
  int iStack_288;
  bool bStack_284;
  undefined8 local_280;
  cpp_dec_float<200U,_int,_void> *local_278;
  undefined8 uStack_270;
  cpp_dec_float<200U,_int,_void> local_268;
  double local_1e8;
  undefined8 uStack_1e0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar39 = 0;
  local_3d0._0_4_ = cpp_dec_float_finite;
  local_3d0._4_4_ = 0x1c;
  local_448._0_16_ = (undefined1  [16])0x0;
  local_448._16_16_ = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = SUB1613((undefined1  [16])0x0,0);
  uStack_3db = 0;
  iStack_3d8 = 0;
  bStack_3d4 = false;
  local_280._0_4_ = cpp_dec_float_finite;
  local_280._4_4_ = 0x1c;
  local_2f8._0_16_ = (undefined1  [16])0x0;
  local_2f8._16_16_ = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = SUB1613((undefined1  [16])0x0,0);
  uStack_28b = 0;
  iStack_288 = 0;
  bStack_284 = false;
  local_c0._0_4_ = cpp_dec_float_finite;
  local_c0._4_4_ = 0x1c;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_138._16_16_ = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_cb = 0;
  iStack_c8 = 0;
  bStack_c4 = false;
  local_140._0_4_ = cpp_dec_float_finite;
  local_140._4_4_ = 0x1c;
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_1b8._16_16_ = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = SUB1613((undefined1  [16])0x0,0);
  local_300 = 0;
  uStack_14b = 0;
  iStack_148 = 0;
  bStack_144 = false;
  local_3ac = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_3ac != LEAVE) {
    pSVar5 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_300 = CONCAT71((int7)((ulong)pSVar5 >> 8),pSVar5->theRep == ROW);
  }
  puVar28 = (uint *)maxabs;
  pcVar29 = &local_268;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar29->data)._M_elems[0] = *puVar28;
    puVar28 = puVar28 + 1;
    pcVar29 = (cpp_dec_float<200U,_int,_void> *)((pcVar29->data)._M_elems + 1);
  }
  local_268.exp = (maxabs->m_backend).exp;
  local_268.neg = (maxabs->m_backend).neg;
  local_1c0 = maxabs;
  local_268.fpclass = (maxabs->m_backend).fpclass;
  local_268.prec_elem = (maxabs->m_backend).prec_elem;
  local_318 = (fpclass_type *)
              (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_310 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3b8 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar18 = (update->thedelta).super_IdxSet.idx;
  pnVar6 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar28 = (uint *)val;
  pcVar29 = &local_b0;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar29->data)._M_elems[0] = *puVar28;
    puVar28 = puVar28 + 1;
    pcVar29 = (cpp_dec_float<200U,_int,_void> *)((pcVar29->data)._M_elems + 1);
  }
  local_b0.exp = (val->m_backend).exp;
  local_b0.neg = (val->m_backend).neg;
  local_b0.fpclass = (val->m_backend).fpclass;
  local_b0.prec_elem = (val->m_backend).prec_elem;
  local_1c8 = val;
  if ((update->thedelta).setupStatus == true) {
    iVar12 = (update->thedelta).super_IdxSet.num;
    local_454 = -1;
    if (start < iVar12) {
      local_3c0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(piVar18 + iVar12);
      piVar18 = piVar18 + start;
      local_278 = (cpp_dec_float<200U,_int,_void> *)*(double *)(in_FS_OFFSET + -8);
      uStack_270 = 0;
      local_1e8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_1e0 = 0x8000000000000000;
      local_3a8 = &(this->fastDelta).m_backend;
      local_308 = (pointer)((long)incr << 2);
      local_454 = -1;
      do {
        iVar12 = *piVar18;
        pnVar21 = pnVar6 + iVar12;
        puVar24 = (undefined4 *)local_448;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar24 = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar39 * -2 + 1) * 4);
          puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
        }
        iStack_3d8 = pnVar6[iVar12].m_backend.exp;
        bStack_3d4 = pnVar6[iVar12].m_backend.neg;
        fVar3 = pnVar6[iVar12].m_backend.fpclass;
        iVar9 = pnVar6[iVar12].m_backend.prec_elem;
        local_3d0._0_4_ = fVar3;
        local_3d0._4_4_ = iVar9;
        if (local_3ac == LEAVE) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (this->iscoid == true) {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (pSVar5->theRep * pDVar15->data[iVar12] < 1) goto LAB_005bdeae;
        }
        else {
LAB_005bdeae:
          local_450 = (SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(local_450._4_4_,iVar12);
          if ((char)local_300 == '\0') {
LAB_005bdf16:
            fVar36 = fVar3;
          }
          else {
            pSVar5 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar7 = (pSVar5->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (pSVar7[iVar12].super_DataKey.info < 1) goto LAB_005bdf16;
            SPxColId::SPxColId((SPxColId *)local_4d8,pSVar7 + iVar12);
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4d8);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar11] == P_FIXED) goto LAB_005be4f1;
            fVar36 = (fpclass_type)local_3d0;
          }
          pnVar23 = &this->epsilon;
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
          }
          iStack_468 = (this->epsilon).m_backend.exp;
          bStack_464 = (this->epsilon).m_backend.neg;
          fVar17 = (this->epsilon).m_backend.fpclass;
          iVar35 = (this->epsilon).m_backend.prec_elem;
          local_460._0_4_ = (this->epsilon).m_backend.fpclass;
          local_460._4_4_ = (this->epsilon).m_backend.prec_elem;
          if (fVar17 == cpp_dec_float_NaN || fVar36 == cpp_dec_float_NaN) {
LAB_005be046:
            pnVar23 = &this->epsilon;
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
            }
            local_460._4_4_ = iVar35;
            local_460._0_4_ = fVar17;
            if (local_4d8._0_4_ != 0 || fVar17 != cpp_dec_float_finite) {
              bStack_464 = (bool)(bStack_464 ^ 1);
            }
            if (((fVar17 == cpp_dec_float_NaN) || ((fpclass_type)local_3d0 == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_448,
                                    (cpp_dec_float<200U,_int,_void> *)local_4d8), -1 < iVar11))
            goto LAB_005be4f1;
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_448;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
            }
            iStack_468 = iStack_3d8;
            bStack_464 = bStack_3d4;
            local_460._0_4_ = (fpclass_type)local_3d0;
            local_460._4_4_ = local_3d0._4_4_;
            if (local_4d8._0_4_ != 0 || (fpclass_type)local_3d0 != cpp_dec_float_finite) {
              bStack_464 = (bool)(bStack_3d4 ^ 1);
            }
            fVar36 = local_268.fpclass;
            if (local_268.fpclass == cpp_dec_float_NaN ||
                (fpclass_type)local_3d0 == cpp_dec_float_NaN) {
LAB_005be384:
              puVar28 = local_268.data._M_elems + 1;
              puVar26 = (uint *)local_398;
              for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar26 = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                puVar26 = puVar26 + (ulong)bVar39 * -2 + 1;
              }
              iVar11 = local_268.exp;
              bVar34 = local_268.neg;
              iVar35 = local_268.prec_elem;
            }
            else {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_4d8,&local_268);
              if (iVar11 < 1) {
                fVar36 = local_268.fpclass;
                goto LAB_005be384;
              }
              puVar24 = (undefined4 *)(local_448 + 4);
              puVar27 = (undefined4 *)local_398;
              for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar27 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
                puVar27 = puVar27 + (ulong)bVar39 * -2 + 1;
              }
              local_268.data._M_elems[0] = 0;
              iVar11 = iStack_3d8;
              iVar35 = local_3d0._4_4_;
              if ((fpclass_type)local_3d0 == cpp_dec_float_finite && local_448._0_4_ == 0) {
                fVar36 = cpp_dec_float_finite;
                bVar34 = bStack_3d4;
              }
              else {
                bVar34 = bStack_3d4 ^ 1;
                fVar36 = (fpclass_type)local_3d0;
                local_268.data._M_elems[0] = local_448._0_4_;
              }
            }
            puVar28 = (uint *)local_398;
            puVar26 = local_268.data._M_elems + 1;
            for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar26 = *puVar28;
              puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
              puVar26 = puVar26 + (ulong)bVar39 * -2 + 1;
            }
            local_268.prec_elem = iVar35;
            local_268.fpclass = fVar36;
            pnVar21 = (pointer)((long)local_318 + (long)iVar12 * 0x80);
            puVar24 = (undefined4 *)local_138;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar24 = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar39 * -2 + 1) * 4);
              puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
            }
            iStack_c8 = (((pointer)((long)local_318 + (long)iVar12 * 0x80))->m_backend).exp;
            bStack_c4 = (((pointer)((long)local_318 + (long)iVar12 * 0x80))->m_backend).neg;
            local_c0._0_4_ = (((pointer)((long)local_318 + (long)iVar12 * 0x80))->m_backend).fpclass
            ;
            local_c0._4_4_ =
                 (((pointer)((long)local_318 + (long)iVar12 * 0x80))->m_backend).prec_elem;
            local_268.exp = iVar11;
            local_268.neg = (bool)bVar34;
            ::soplex::infinity::__tls_init();
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4d8,(double)local_278);
            if ((((fpclass_type)local_c0 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_460 == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_138,
                                    (cpp_dec_float<200U,_int,_void> *)local_4d8), -1 < iVar11))
            goto LAB_005be4f1;
            pcVar29 = &local_3b8[iVar12].m_backend;
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_4d8 == pcVar29) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                         (cpp_dec_float<200U,_int,_void> *)local_138);
              if (local_4d8._0_4_ == 0 && (fpclass_type)local_460 == cpp_dec_float_finite) {
                local_280._0_4_ = cpp_dec_float_finite;
              }
              else {
                bStack_464 = (bool)(bStack_464 ^ 1);
                local_280._0_4_ = (fpclass_type)local_460;
              }
            }
            else {
              puVar28 = (uint *)local_138;
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar30->data)._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4)
                ;
              }
              iStack_468 = iStack_c8;
              bStack_464 = bStack_c4;
              local_460._0_4_ = (fpclass_type)local_c0;
              local_460._4_4_ = local_c0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar29);
              local_280._0_4_ = (fpclass_type)local_460;
            }
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            puVar28 = (uint *)local_2f8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar28 = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
            }
            iStack_288 = iStack_468;
            bStack_284 = bStack_464;
            local_280._4_4_ = local_460._4_4_;
            if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
LAB_005be8ab:
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
              if ((cpp_dec_float<200U,_int,_void> *)local_398 != local_3a8) {
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar29 + (ulong)bVar39 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                }
                iStack_328 = iStack_288;
                bStack_324 = bStack_284;
                local_320._0_4_ = (fpclass_type)local_280;
                local_320._4_4_ = local_280._4_4_;
                pcVar29 = local_3a8;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar29);
              goto LAB_005be9aa;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8);
            if (0 < iVar12) goto LAB_005be8ab;
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4d8,local_3a8,
                       (cpp_dec_float<200U,_int,_void> *)local_448);
          }
          else {
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_448,
                                (cpp_dec_float<200U,_int,_void> *)local_4d8);
            if (iVar11 < 1) {
              iStack_468 = (this->epsilon).m_backend.exp;
              bStack_464 = (this->epsilon).m_backend.neg;
              fVar17 = (this->epsilon).m_backend.fpclass;
              iVar35 = (this->epsilon).m_backend.prec_elem;
              goto LAB_005be046;
            }
            piVar16 = &local_268.prec_elem;
            fVar36 = local_268.fpclass;
            if (local_268.fpclass != cpp_dec_float_NaN &&
                (fpclass_type)local_3d0 != cpp_dec_float_NaN) {
              iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_448,&local_268);
              if (iVar11 < 1) {
                piVar16 = &local_268.prec_elem;
                fVar36 = local_268.fpclass;
              }
              else {
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_448;
                pcVar30 = &local_268;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar29 + (ulong)bVar39 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                }
                local_268.exp = iStack_3d8;
                local_268.neg = bStack_3d4;
                piVar16 = (int32_t *)((long)&local_3d0 + 4);
                fVar36 = (fpclass_type)local_3d0;
              }
            }
            local_268.fpclass = fVar36;
            local_268.prec_elem = *piVar16;
            pnVar21 = (pointer)((long)local_310 + (long)iVar12 * 0x80);
            puVar24 = (undefined4 *)local_1b8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar24 = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar39 * -2 + 1) * 4);
              puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
            }
            iStack_148 = (((pointer)((long)local_310 + (long)iVar12 * 0x80))->m_backend).exp;
            bStack_144 = (((pointer)((long)local_310 + (long)iVar12 * 0x80))->m_backend).neg;
            local_140._0_4_ =
                 (((pointer)((long)local_310 + (long)iVar12 * 0x80))->m_backend).fpclass;
            local_140._4_4_ =
                 (((pointer)((long)local_310 + (long)iVar12 * 0x80))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4d8,local_1e8);
            if ((((fpclass_type)local_140 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_460 == cpp_dec_float_NaN)) ||
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_1b8,
                                    (cpp_dec_float<200U,_int,_void> *)local_4d8), iVar11 < 1))
            goto LAB_005be4f1;
            pcVar29 = &local_3b8[iVar12].m_backend;
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_4d8 == pcVar29) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                         (cpp_dec_float<200U,_int,_void> *)local_1b8);
              if (local_4d8._0_4_ == 0 && (fpclass_type)local_460 == cpp_dec_float_finite) {
                local_280._0_4_ = cpp_dec_float_finite;
              }
              else {
                bStack_464 = (bool)(bStack_464 ^ 1);
                local_280._0_4_ = (fpclass_type)local_460;
              }
            }
            else {
              puVar28 = (uint *)local_1b8;
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar30->data)._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4)
                ;
              }
              iStack_468 = iStack_148;
              bStack_464 = bStack_144;
              local_460._0_4_ = (fpclass_type)local_140;
              local_460._4_4_ = local_140._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar29);
              local_280._0_4_ = (fpclass_type)local_460;
            }
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            puVar28 = (uint *)local_2f8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar28 = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
            }
            iStack_288 = iStack_468;
            bStack_284 = bStack_464;
            local_280._4_4_ = local_460._4_4_;
            if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
LAB_005be6fe:
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_398 == local_3a8) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_398,
                           (cpp_dec_float<200U,_int,_void> *)local_2f8);
                if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                  bStack_324 = (bool)(bStack_324 ^ 1);
                }
              }
              else {
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar29 + (ulong)bVar39 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                }
                iStack_328 = iStack_288;
                bStack_324 = bStack_284;
                local_320._0_4_ = (fpclass_type)local_280;
                local_320._4_4_ = local_280._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_398,local_3a8);
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8);
              if (iVar12 < 0) goto LAB_005be6fe;
              pcVar29 = local_3a8;
              puVar28 = (uint *)local_398;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar28 = (pcVar29->data)._M_elems[0];
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4)
                ;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
              }
              iStack_328 = (this->fastDelta).m_backend.exp;
              bStack_324 = (this->fastDelta).m_backend.neg;
              local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
              local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
                bStack_324 = (bool)(bStack_324 ^ 1);
              }
            }
LAB_005be9aa:
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            bStack_464 = false;
            iStack_468 = 0;
            uStack_46b = 0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            local_488 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                       (cpp_dec_float<200U,_int,_void> *)local_398,
                       (cpp_dec_float<200U,_int,_void> *)local_448);
          }
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_448;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
          }
          iStack_3d8 = iStack_468;
          bStack_3d4 = bStack_464;
          local_3d0._0_4_ = (fpclass_type)local_460;
          local_3d0._4_4_ = local_460._4_4_;
          if (((fpclass_type)local_460 != cpp_dec_float_NaN) &&
             (local_b0.fpclass != cpp_dec_float_NaN)) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_448,&local_b0);
            if (0 < iVar12) {
              puVar28 = (uint *)local_448;
              pcVar29 = &local_b0;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar29->data)._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar29 + ((ulong)bVar39 * -2 + 1) * 4);
              }
              local_b0.exp = iStack_3d8;
              local_b0.neg = bStack_3d4;
              local_b0.fpclass = (fpclass_type)local_3d0;
              local_b0.prec_elem = local_3d0._4_4_;
              local_454 = (int)local_450;
            }
          }
        }
LAB_005be4f1:
        piVar18 = (int *)((long)piVar18 + (long)local_308);
      } while (piVar18 < local_3c0);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar14 = (long)(int)((ulong)((long)(update->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_3b8)
                        >> 7);
    if (lVar14 < 1) {
      local_454 = -1;
      piVar20 = piVar18;
      local_1d0 = update;
    }
    else {
      local_1d0 = update;
      local_3c0 = &this->epsilon;
      local_3a8 = (cpp_dec_float<200U,_int,_void> *)*(double *)(in_FS_OFFSET + -8);
      uStack_3a0 = 0;
      local_1e8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_1e0 = 0x8000000000000000;
      local_278 = &(this->fastDelta).m_backend;
      local_310 = &(((pointer)local_310)->m_backend).fpclass;
      local_318 = &(((pointer)local_318)->m_backend).fpclass;
      local_454 = -1;
      lVar37 = 0;
      lVar38 = 0;
      lVar19 = 0;
      local_450 = this;
      local_308 = pnVar6 + lVar14;
      do {
        this_00 = (cpp_dec_float<200u,int,void> *)((long)&(pnVar6->m_backend).data + lVar38);
        pcVar22 = this_00;
        puVar24 = (undefined4 *)local_448;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar24 = *(undefined4 *)pcVar22;
          pcVar22 = pcVar22 + (ulong)bVar39 * -8 + 4;
          puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
        }
        iStack_3d8 = *(int *)((long)&(pnVar6->m_backend).data + lVar38 + 0x70);
        bStack_3d4 = (bool)*(byte *)((long)&(pnVar6->m_backend).data + lVar38 + 0x74);
        uVar8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar38 + 0x78);
        local_3d0._0_4_ = (fpclass_type)uVar8;
        local_3d0._4_4_ = SUB84(uVar8,4);
        piVar20 = piVar18;
        if ((fpclass_type)uVar8 != cpp_dec_float_NaN) {
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4d8,0.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_448,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar12 != 0) goto LAB_005bec71;
          goto LAB_005bfa3f;
        }
LAB_005bec71:
        pnVar23 = local_3c0;
        pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
        }
        bStack_464 = (this->epsilon).m_backend.neg;
        iStack_468 = (this->epsilon).m_backend.exp;
        fVar4 = (this->epsilon).m_backend.fpclass;
        iVar10 = (this->epsilon).m_backend.prec_elem;
        local_460._0_4_ = fVar4;
        local_460._4_4_ = iVar10;
        if (local_4d8._0_4_ != 0 || fVar4 != cpp_dec_float_finite) {
          bStack_464 = (bool)(bStack_464 ^ 1);
        }
        if ((fVar4 != cpp_dec_float_NaN) && ((fpclass_type)local_3d0 != cpp_dec_float_NaN)) {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_448,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (-1 < iVar12) {
            pnVar23 = local_3c0;
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_398;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
            }
            iStack_328 = (this->epsilon).m_backend.exp;
            bStack_324 = (this->epsilon).m_backend.neg;
            fVar1 = (this->epsilon).m_backend.fpclass;
            iVar2 = (this->epsilon).m_backend.prec_elem;
            local_320._0_4_ = fVar1;
            local_320._4_4_ = iVar2;
            if ((fVar1 != cpp_dec_float_NaN && (fpclass_type)local_3d0 != cpp_dec_float_NaN) &&
               (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_448,
                                    (cpp_dec_float<200U,_int,_void> *)local_398), iVar12 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
              goto LAB_005bfa3f;
            }
          }
        }
        piVar20 = piVar18 + 1;
        *piVar18 = (int)lVar19;
        if (local_3ac == LEAVE) {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (this->iscoid == true) {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar15 = (pSVar5->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (0 < pSVar5->theRep * pDVar15->data[lVar19]) goto LAB_005bfa3f;
        }
        if ((char)local_300 != '\0') {
          pSVar5 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar5->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar37)) {
            SPxColId::SPxColId((SPxColId *)local_4d8,
                               (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar37));
            iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar5->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4d8);
            if ((pSVar5->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_005bfa3f;
          }
        }
        puVar28 = local_268.data._M_elems + 1;
        pnVar23 = local_3c0;
        pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
        }
        iStack_468 = (this->epsilon).m_backend.exp;
        bStack_464 = (this->epsilon).m_backend.neg;
        fVar36 = (this->epsilon).m_backend.fpclass;
        iVar35 = (this->epsilon).m_backend.prec_elem;
        local_460._0_4_ = (this->epsilon).m_backend.fpclass;
        local_460._4_4_ = (this->epsilon).m_backend.prec_elem;
        if (fVar36 == cpp_dec_float_NaN || (fpclass_type)local_3d0 == cpp_dec_float_NaN) {
LAB_005bef68:
          pnVar23 = local_3c0;
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar29->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
          }
          local_460._4_4_ = iVar35;
          local_460._0_4_ = fVar36;
          if (local_4d8._0_4_ != 0 || fVar36 != cpp_dec_float_finite) {
            bStack_464 = (bool)(bStack_464 ^ 1);
          }
          if (((fVar36 != cpp_dec_float_NaN) && ((fpclass_type)local_3d0 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_448,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8), this = local_450,
             iVar12 < 0)) {
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_448;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar14 = 0x1c; this = local_450, lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
            }
            iStack_468 = iStack_3d8;
            bStack_464 = bStack_3d4;
            local_460._0_4_ = (fpclass_type)local_3d0;
            local_460._4_4_ = local_3d0._4_4_;
            if (local_4d8._0_4_ != 0 || (fpclass_type)local_3d0 != cpp_dec_float_finite) {
              bStack_464 = (bool)(bStack_3d4 ^ 1);
            }
            fVar36 = local_268.fpclass;
            if (local_268.fpclass == cpp_dec_float_NaN ||
                (fpclass_type)local_3d0 == cpp_dec_float_NaN) {
LAB_005bf2fe:
              puVar26 = puVar28;
              puVar31 = (uint *)local_398;
              for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar31 = *puVar26;
                puVar26 = puVar26 + (ulong)bVar39 * -2 + 1;
                puVar31 = puVar31 + (ulong)bVar39 * -2 + 1;
              }
              iVar12 = local_268.exp;
              bVar34 = local_268.neg;
              iVar35 = local_268.prec_elem;
            }
            else {
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_4d8,&local_268);
              if (iVar12 < 1) {
                fVar36 = local_268.fpclass;
                goto LAB_005bf2fe;
              }
              puVar24 = (undefined4 *)(local_448 + 4);
              puVar27 = (undefined4 *)local_398;
              for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar27 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
                puVar27 = puVar27 + (ulong)bVar39 * -2 + 1;
              }
              local_268.data._M_elems[0] = 0;
              iVar12 = iStack_3d8;
              iVar35 = local_3d0._4_4_;
              if ((fpclass_type)local_3d0 == cpp_dec_float_finite && local_448._0_4_ == 0) {
                fVar36 = cpp_dec_float_finite;
                bVar34 = bStack_3d4;
              }
              else {
                bVar34 = bStack_3d4 ^ 1;
                fVar36 = (fpclass_type)local_3d0;
                local_268.data._M_elems[0] = local_448._0_4_;
              }
            }
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_398;
            for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar28 = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
            }
            local_268.prec_elem = iVar35;
            local_268.fpclass = fVar36;
            puVar24 = (undefined4 *)((long)local_318 + lVar38 + -0x78);
            puVar27 = puVar24;
            puVar32 = (undefined4 *)local_138;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar32 = *puVar27;
              puVar27 = puVar27 + (ulong)bVar39 * -2 + 1;
              puVar32 = puVar32 + (ulong)bVar39 * -2 + 1;
            }
            iStack_c8 = puVar24[0x1c];
            bStack_c4 = *(bool *)(puVar24 + 0x1d);
            local_c0 = *(undefined8 *)(puVar24 + 0x1e);
            local_268.exp = iVar12;
            local_268.neg = (bool)bVar34;
            ::soplex::infinity::__tls_init();
            local_460._0_4_ = cpp_dec_float_finite;
            local_460._4_4_ = 0x1c;
            local_4d8._0_16_ = (undefined1  [16])0x0;
            local_4d8._16_16_ = (undefined1  [16])0x0;
            local_4b8 = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = SUB1613((undefined1  [16])0x0,0);
            uStack_46b = 0;
            iStack_468 = 0;
            bStack_464 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4d8,(double)local_3a8);
            if (((fpclass_type)local_c0 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_460 != cpp_dec_float_NaN)) {
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_138,
                                  (cpp_dec_float<200U,_int,_void> *)local_4d8);
              if (iVar12 < 0) {
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b8->m_backend + lVar38);
                local_460._0_4_ = cpp_dec_float_finite;
                local_460._4_4_ = 0x1c;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                if (pcVar29 == (cpp_dec_float<200U,_int,_void> *)local_4d8) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                             (cpp_dec_float<200U,_int,_void> *)local_138);
                  if (local_4d8._0_4_ == 0 && (fpclass_type)local_460 == cpp_dec_float_finite) {
                    local_280._0_4_ = cpp_dec_float_finite;
                  }
                  else {
                    bStack_464 = (bool)(bStack_464 ^ 1);
                    local_280._0_4_ = (fpclass_type)local_460;
                  }
                }
                else {
                  puVar28 = (uint *)local_138;
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar30->data)._M_elems[0] = *puVar28;
                    puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                  }
                  iStack_468 = iStack_c8;
                  bStack_464 = bStack_c4;
                  local_460._0_4_ = (fpclass_type)local_c0;
                  local_460._4_4_ = local_c0._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar29);
                  local_280._0_4_ = (fpclass_type)local_460;
                }
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                puVar28 = (uint *)local_2f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *puVar28 = (pcVar29->data)._M_elems[0];
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar29 + (ulong)bVar39 * -8 + 4);
                  puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                }
                iStack_288 = iStack_468;
                bStack_284 = bStack_464;
                local_280._4_4_ = local_460._4_4_;
                if ((fpclass_type)local_280 != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                                      (cpp_dec_float<200U,_int,_void> *)local_4d8);
                  if (iVar12 < 1) {
                    local_460._0_4_ = cpp_dec_float_finite;
                    local_460._4_4_ = 0x1c;
                    local_4d8._0_16_ = (undefined1  [16])0x0;
                    local_4d8._16_16_ = (undefined1  [16])0x0;
                    local_4b8 = (undefined1  [16])0x0;
                    local_4a8 = (undefined1  [16])0x0;
                    local_498 = (undefined1  [16])0x0;
                    local_488 = (undefined1  [16])0x0;
                    local_478 = SUB1613((undefined1  [16])0x0,0);
                    uStack_46b = 0;
                    iStack_468 = 0;
                    bStack_464 = false;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)local_4d8,local_278,
                               (cpp_dec_float<200U,_int,_void> *)local_448);
                    goto LAB_005bf688;
                  }
                }
                pcVar29 = local_278;
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
                if ((cpp_dec_float<200U,_int,_void> *)local_398 != local_278) {
                  pcVar33 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                    (pcVar33->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                    pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                    pcVar33 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar33 + (ulong)bVar39 * -8 + 4);
                  }
                  iStack_328 = iStack_288;
                  bStack_324 = bStack_284;
                  local_320._0_4_ = (fpclass_type)local_280;
                  local_320._4_4_ = local_280._4_4_;
                  pcVar30 = pcVar29;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar30);
LAB_005bf90e:
                local_460._0_4_ = cpp_dec_float_finite;
                local_460._4_4_ = 0x1c;
                local_4d8._0_16_ = (undefined1  [16])0x0;
                local_4d8._16_16_ = (undefined1  [16])0x0;
                local_4b8 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = SUB1613((undefined1  [16])0x0,0);
                uStack_46b = 0;
                iStack_468 = 0;
                bStack_464 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                           (cpp_dec_float<200U,_int,_void> *)local_398,
                           (cpp_dec_float<200U,_int,_void> *)local_448);
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_448;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar29 + (ulong)bVar39 * -8 + 4);
                  pcVar30 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar30 + (ulong)bVar39 * -8 + 4);
                }
                iStack_3d8 = iStack_468;
                bStack_3d4 = bStack_464;
                local_3d0._0_4_ = (fpclass_type)local_460;
                local_3d0._4_4_ = local_460._4_4_;
                this = local_450;
                goto LAB_005bf9b9;
              }
            }
          }
        }
        else {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_448,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar12 < 1) {
            iStack_468 = (this->epsilon).m_backend.exp;
            bStack_464 = (this->epsilon).m_backend.neg;
            fVar36 = (this->epsilon).m_backend.fpclass;
            iVar35 = (this->epsilon).m_backend.prec_elem;
            goto LAB_005bef68;
          }
          piVar16 = &local_268.prec_elem;
          fVar36 = local_268.fpclass;
          if (local_268.fpclass != cpp_dec_float_NaN && (fpclass_type)local_3d0 != cpp_dec_float_NaN
             ) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_448,&local_268);
            if (iVar12 < 1) {
              piVar16 = &local_268.prec_elem;
              fVar36 = local_268.fpclass;
            }
            else {
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_448;
              pcVar30 = &local_268;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
                pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4)
                ;
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4)
                ;
              }
              local_268.exp = iStack_3d8;
              local_268.neg = bStack_3d4;
              piVar16 = (int32_t *)((long)&local_3d0 + 4);
              fVar36 = (fpclass_type)local_3d0;
            }
          }
          local_268.fpclass = fVar36;
          local_268.prec_elem = *piVar16;
          puVar13 = (undefined8 *)((long)local_310 + lVar38);
          puVar25 = puVar13 + -0xf;
          puVar24 = (undefined4 *)local_1b8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar24 = *(undefined4 *)puVar25;
            puVar25 = (undefined8 *)((long)puVar25 + (ulong)bVar39 * -8 + 4);
            puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
          }
          iStack_148 = *(int *)(puVar13 + -1);
          bStack_144 = *(bool *)((long)puVar13 + -4);
          local_140 = *puVar13;
          ::soplex::infinity::__tls_init();
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4d8,local_1e8);
          if (((fpclass_type)local_140 == cpp_dec_float_NaN) ||
             ((fpclass_type)local_460 == cpp_dec_float_NaN)) goto LAB_005bfa3f;
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_1b8,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar12 < 1) goto LAB_005bfa3f;
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3b8->m_backend + lVar38);
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          if (pcVar29 == (cpp_dec_float<200U,_int,_void> *)local_4d8) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                       (cpp_dec_float<200U,_int,_void> *)local_1b8);
            if (local_4d8._0_4_ == 0 && (fpclass_type)local_460 == cpp_dec_float_finite) {
              local_280._0_4_ = cpp_dec_float_finite;
            }
            else {
              bStack_464 = (bool)(bStack_464 ^ 1);
              local_280._0_4_ = (fpclass_type)local_460;
            }
          }
          else {
            puVar28 = (uint *)local_1b8;
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar30->data)._M_elems[0] = *puVar28;
              puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
            }
            iStack_468 = iStack_148;
            bStack_464 = bStack_144;
            local_460._0_4_ = (fpclass_type)local_140;
            local_460._4_4_ = local_140._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_4d8,pcVar29);
            local_280._0_4_ = (fpclass_type)local_460;
          }
          pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_4d8;
          puVar28 = (uint *)local_2f8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar28 = (pcVar29->data)._M_elems[0];
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
            puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
          }
          iStack_288 = iStack_468;
          bStack_284 = bStack_464;
          local_280._4_4_ = local_460._4_4_;
          if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
LAB_005bf6be:
            pcVar29 = local_278;
            local_320._0_4_ = cpp_dec_float_finite;
            local_320._4_4_ = 0x1c;
            local_398._0_16_ = (undefined1  [16])0x0;
            local_398._16_16_ = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = (undefined1  [16])0x0;
            local_338 = SUB1613((undefined1  [16])0x0,0);
            uStack_32b = 0;
            iStack_328 = 0;
            bStack_324 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_398 == local_278) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,
                         (cpp_dec_float<200U,_int,_void> *)local_2f8);
              if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                bStack_324 = (bool)(bStack_324 ^ 1);
              }
            }
            else {
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
              pcVar33 = (cpp_dec_float<200U,_int,_void> *)local_398;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar33->data)._M_elems[0] = (pcVar30->data)._M_elems[0];
                pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4)
                ;
                pcVar33 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar33 + (ulong)bVar39 * -8 + 4)
                ;
              }
              iStack_328 = iStack_288;
              bStack_324 = bStack_284;
              local_320._0_4_ = (fpclass_type)local_280;
              local_320._4_4_ = local_280._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar29);
            }
            goto LAB_005bf90e;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_4d8,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                              (cpp_dec_float<200U,_int,_void> *)local_4d8);
          if (iVar12 < 0) goto LAB_005bf6be;
          pcVar29 = local_278;
          pcVar30 = (cpp_dec_float<200U,_int,_void> *)local_398;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
            pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
          }
          iStack_328 = (this->fastDelta).m_backend.exp;
          bStack_324 = (this->fastDelta).m_backend.neg;
          local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
          local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
          if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
            bStack_324 = (bool)(bStack_324 ^ 1);
          }
          local_460._0_4_ = cpp_dec_float_finite;
          local_460._4_4_ = 0x1c;
          local_4d8._0_16_ = (undefined1  [16])0x0;
          local_4d8._16_16_ = (undefined1  [16])0x0;
          local_4b8 = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = SUB1613((undefined1  [16])0x0,0);
          uStack_46b = 0;
          iStack_468 = 0;
          bStack_464 = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_4d8,
                     (cpp_dec_float<200U,_int,_void> *)local_398,
                     (cpp_dec_float<200U,_int,_void> *)local_448);
LAB_005bf688:
          puVar24 = (undefined4 *)local_4d8;
          puVar27 = (undefined4 *)local_448;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar27 = *puVar24;
            puVar24 = puVar24 + (ulong)bVar39 * -2 + 1;
            puVar27 = puVar27 + (ulong)bVar39 * -2 + 1;
          }
          iStack_3d8 = iStack_468;
          bStack_3d4 = bStack_464;
          local_3d0._0_4_ = (fpclass_type)local_460;
          local_3d0._4_4_ = local_460._4_4_;
LAB_005bf9b9:
          if ((((fpclass_type)local_460 != cpp_dec_float_NaN) &&
              (local_b0.fpclass != cpp_dec_float_NaN)) &&
             (iStack_3d8 = iStack_468, bStack_3d4 = bStack_464, local_3d0 = local_460,
             iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_448,&local_b0), 0 < iVar12)
             ) {
            pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_448;
            pcVar30 = &local_b0;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar30->data)._M_elems[0] = (pcVar29->data)._M_elems[0];
              pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + (ulong)bVar39 * -8 + 4);
              pcVar30 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar30 + (ulong)bVar39 * -8 + 4);
            }
            local_b0.exp = iStack_3d8;
            local_b0.neg = bStack_3d4;
            local_b0.fpclass = (fpclass_type)local_3d0;
            local_b0.prec_elem = local_3d0._4_4_;
            local_454 = (int)lVar19;
          }
        }
LAB_005bfa3f:
        lVar19 = lVar19 + 1;
        lVar37 = lVar37 + 8;
        pnVar21 = (pointer)((long)&pnVar6[1].m_backend.data + lVar38);
        lVar38 = lVar38 + 0x80;
        piVar18 = piVar20;
      } while (pnVar21 < local_308);
      piVar18 = (local_1d0->thedelta).super_IdxSet.idx;
    }
    (local_1d0->thedelta).super_IdxSet.num = (int)((ulong)((long)piVar20 - (long)piVar18) >> 2);
    (local_1d0->thedelta).setupStatus = true;
  }
  pcVar29 = &local_b0;
  pnVar23 = local_1c8;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (pcVar29->data)._M_elems[0];
    pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  (local_1c8->m_backend).exp = local_b0.exp;
  (local_1c8->m_backend).neg = local_b0.neg;
  (local_1c8->m_backend).fpclass = local_b0.fpclass;
  (local_1c8->m_backend).prec_elem = local_b0.prec_elem;
  pcVar29 = &local_268;
  pnVar23 = local_1c0;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = (pcVar29->data)._M_elems[0];
    pcVar29 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar29 + ((ulong)bVar39 * -2 + 1) * 4);
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  (local_1c0->m_backend).exp = local_268.exp;
  (local_1c0->m_backend).neg = local_268.neg;
  (local_1c0->m_backend).fpclass = local_268.fpclass;
  (local_1c0->m_backend).prec_elem = local_268.prec_elem;
  return local_454;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}